

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

void rde_aux(List *code,PatternRange *ranges,int m68kop,ParsedOpcodeInfo *info,CCVariant *var,
            int expand_mask)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  CCVariant *pCVar7;
  uint *var_00;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar9 = (ulong)(uint)expand_mask;
  do {
    if (code == (List *)0x0) {
      return;
    }
    uVar6 = (code->token).type - TOK_DOLLAR_DATA_REGISTER;
    var_00 = (uint *)var;
    if (7 < uVar6) goto LAB_0010d99e;
    bVar1 = (code->token).u.reginfo.which;
    iVar2 = ranges[bVar1].index;
    pCVar7 = (CCVariant *)(long)iVar2;
    uVar3 = ranges[bVar1].length;
    var_00 = (uint *)pCVar7;
    if (0x10 < (int)(uVar3 + iVar2)) goto LAB_0010d99e;
    uVar8 = 1 << (0xfU - (char)iVar2 & 0x1f);
    uVar9 = (ulong)uVar8;
    uVar5 = 0;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    uVar4 = 0;
    for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      if ((&pCVar7->field_0x0)[uVar5 + *(long *)&info->cpu] == '-') goto LAB_0010d99e;
      uVar10 = (1 << ((byte)(uVar3 - 1) & 0x1f)) >> ((byte)uVar5 & 0x1f);
      if (((int)uVar8 >> ((byte)uVar5 & 0x1f) & m68kop) == 0) {
        uVar10 = 0;
      }
      uVar4 = uVar4 | uVar10;
    }
    var_00 = &switchD_0010d8a8::switchdataD_00111c98;
    switch(uVar6) {
    case 0:
      (code->token).type = TOK_DATA_REGISTER;
      goto LAB_0010d99a;
    case 1:
      (code->token).type = TOK_ADDRESS_REGISTER;
      goto LAB_0010d99a;
    case 2:
      (code->token).type = 7 < (int)uVar4 | TOK_DATA_REGISTER;
      (code->token).u.reginfo.which = (uchar)((int)uVar4 % 8);
      break;
    case 3:
      uVar6 = uVar4 >> 3 & 7;
      if (uVar6 == 1) {
        (code->token).type = TOK_ADDRESS_REGISTER;
      }
      else {
        if (uVar6 != 0) {
          (code->token).type = TOK_AMODE;
          goto LAB_0010d99a;
        }
        (code->token).type = TOK_DATA_REGISTER;
      }
      uVar4 = (uint)((byte)uVar4 & 7);
LAB_0010d99a:
      (code->token).u.reginfo.which = (uchar)uVar4;
      break;
    case 4:
      uVar6 = uVar4 & 7;
      if (uVar6 == 1) {
        (code->token).type = TOK_ADDRESS_REGISTER;
        (code->token).u.reginfo.which = '\x01';
      }
      else if (uVar6 == 0) {
        (code->token).type = TOK_DATA_REGISTER;
        (code->token).u.reginfo.which = '\0';
      }
      else {
        (code->token).type = TOK_REVERSED_AMODE;
        (code->token).u.reginfo.which = ((byte)(uVar4 >> 3) & 7) + (char)uVar6 * '\b';
      }
      break;
    case 5:
      (code->token).type = TOK_NUMBER;
      if (((code->token).u.reginfo.sgnd != '\0') &&
         (((ulong)(long)(int)uVar4 >> ((ulong)(uVar3 - 1) & 0x3f) & 1) != 0)) {
        uVar4 = uVar4 | (uint)(-1L << ((byte)uVar3 & 0x3f));
      }
      (code->token).u = (anon_union_8_7_0ba269be_for_u)(long)(int)uVar4;
      break;
    default:
      fatal_error("Internal error: generate_code.c: IS_DOLLAR_TOKEN() must be bad.\n");
      var_00 = (uint *)pCVar7;
    }
LAB_0010d99e:
    rde_aux(code->car,ranges,m68kop,info,(CCVariant *)var_00,(int)uVar9);
    code = code->cdr;
    var = (CCVariant *)var_00;
  } while( true );
}

Assistant:

static void
rde_aux (List *code, const PatternRange *ranges, int m68kop,
	 const ParsedOpcodeInfo *info, const CCVariant *var, int expand_mask)
{
  Token *t;

  /* Base case: NULL list. */
  if (code == NULL)
    return;

  /* If we find a $ identifier, replace it with the appropriate expression. */
  t = &code->token;
  if (IS_DOLLAR_TOKEN (t->type))
    {
      int index, length;
      BOOL is_constant = FALSE;
      int constant;
      
      /* Fetch the bit range of that field. */
      index = ranges[t->u.dollarinfo.which].index;
      length = ranges[t->u.dollarinfo.which].length;
      
      /* See if this collapses to a known constant. */
      if (index + length <= 16)
	{
	  int i;
	  
	  /* Grab the constant and see if it's legitimate. */
	  constant = 0;
	  is_constant = TRUE;
	  for (i = 0; i < length; i++)
	    {
	      if (var->bits_to_expand[i + index] == '-')
		{
		  is_constant = FALSE;
		  break;
		}
	      else if (m68kop & ((1 << (15 - index)) >> i))
		constant |= (1 << (length - 1)) >> i;
	    }
	}
      else
	constant = 0;  /* To avoid compiler warnings. */

      if (is_constant)
	handle_constant_dollar_field (code, constant, length);
      else
	{
	}
    }

  /* Recurse on the rest of the list. */
  rde_aux (code->car, ranges, m68kop, info, var, expand_mask);
  rde_aux (code->cdr, ranges, m68kop, info, var, expand_mask);
}